

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_GetMethodProperty<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,Var varInstance,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  ScriptFunction *object;
  PropertyId propertyId_00;
  bool bVar1;
  Type *this_00;
  JavascriptMethod p_Var2;
  FunctionBody *functionBody;
  ScriptContext *requestContext;
  ScriptFunction *local_b0;
  ScriptFunction *local_a8;
  Var local_98;
  Var aValue;
  PropertyValueInfo info;
  InlineCache *inlineCache;
  ScriptFunction *fn;
  RecyclableObject *obj;
  OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *pOStack_30;
  PropertyId propertyId;
  OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  Var varInstance_local;
  InterpreterStackFrame *this_local;
  ScriptFunction *local_10;
  
  pOStack_30 = playout;
  playout_local = (OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *)varInstance;
  varInstance_local = this;
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(varInstance);
  obj._4_4_ = GetPropertyIdFromCacheId(this,pOStack_30->inlineCacheIndex);
  this_local = (InterpreterStackFrame *)playout_local;
  bVar1 = VarIs<Js::RecyclableObject>(playout_local);
  if (bVar1) {
    local_a8 = (ScriptFunction *)UnsafeVarTo<Js::RecyclableObject>(this_local);
  }
  else {
    local_a8 = (ScriptFunction *)0x0;
  }
  fn = local_a8;
  if (local_a8 != (ScriptFunction *)0x0) {
    local_10 = local_a8;
    bVar1 = VarIs<Js::ScriptFunction,Js::RecyclableObject>((RecyclableObject *)local_a8);
    if (bVar1) {
      local_b0 = UnsafeVarTo<Js::ScriptFunction,Js::RecyclableObject>((RecyclableObject *)local_10);
    }
    else {
      local_b0 = (ScriptFunction *)0x0;
    }
    inlineCache = (InlineCache *)local_b0;
    if (((obj._4_4_ == 0x4e) || (obj._4_4_ == 0x5a)) && (local_b0 != (ScriptFunction *)0x0)) {
      this_00 = RecyclableObject::GetType((RecyclableObject *)local_b0);
      p_Var2 = Js::Type::GetEntryPoint(this_00);
      if (p_Var2 == JavascriptFunction::DeferredParsingThunk) {
        JavascriptFunction::DeferredParse((ScriptFunction **)&inlineCache);
      }
    }
  }
  info._56_8_ = GetInlineCache(this,pOStack_30->inlineCacheIndex);
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&aValue);
  functionBody = GetFunctionBody(this);
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)&aValue,functionBody,(InlineCache *)info._56_8_,
             pOStack_30->inlineCacheIndex,true);
  propertyId_00 = obj._4_4_;
  object = fn;
  if (fn != (ScriptFunction *)0x0) {
    requestContext = GetScriptContext(this);
    bVar1 = CacheOperators::TryGetProperty<true,true,false,false,false,false,true,false,false,false>
                      (object,false,(RecyclableObject *)object,propertyId_00,&local_98,
                       requestContext,(PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)&aValue
                      );
    if (bVar1) {
      SetReg<unsigned_int>(this,pOStack_30->Value,local_98);
      return;
    }
  }
  OP_GetMethodProperty_NoFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
            (this,playout_local,pOStack_30);
  return;
}

Assistant:

void InterpreterStackFrame::OP_GetMethodProperty(Var varInstance, unaligned T *playout)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(varInstance);
#endif
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        RecyclableObject* obj = JavascriptOperators::TryFromVar<RecyclableObject>(varInstance);
        if (obj)
        {
            ScriptFunction *fn = JavascriptOperators::TryFromVar<ScriptFunction>(obj);
            if ((propertyId == PropertyIds::apply || propertyId == PropertyIds::call) && fn)
            {
                // If the property being loaded is "apply"/"call", make an optimistic assumption that apply/call is not overridden and
                // undefer the function right here if it was defer parsed before. This is required so that the load of "apply"/"call"
                // happens from the same "type". Otherwise, we will have a polymorphic cache for load of "apply"/"call".
                if (fn->GetType()->GetEntryPoint() == JavascriptFunction::DeferredParsingThunk)
                {
                    JavascriptFunction::DeferredParse(&fn);
                }
            }
        }

        InlineCache *inlineCache = this->GetInlineCache(playout->inlineCacheIndex);

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, GetFunctionBody(), inlineCache, playout->inlineCacheIndex, true);
        Var aValue;
        if (obj &&
            CacheOperators::TryGetProperty<true, true, false, false, false, false, true, false, false, false>(
                obj, false, obj, propertyId, &aValue, GetScriptContext(), nullptr, &info))
        {
            SetReg(playout->Value, aValue);
            return;
        }

        OP_GetMethodProperty_NoFastPath(varInstance, playout);
    }